

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O1

void __thiscall
Rml::GeometryBackgroundBorder::DrawArc
          (GeometryBackgroundBorder *this,Vector2f pos_center,Vector2f r,float a0,float a1,
          ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *this_00;
  code *pcVar1;
  int iVar2;
  bool bVar3;
  ColourbPremultiplied CVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float t;
  float local_88;
  float fStack_84;
  
  if (((num_points < 2) || (r.x <= 0.0)) || (r.y <= 0.0)) {
    bVar3 = Assert("RMLUI_ASSERT(num_points >= 2 && r.x > 0 && r.y > 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                   ,0xb9);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  this_00 = this->vertices;
  iVar2 = (int)((long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x33333333;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize
            (this_00,(long)(iVar2 + num_points));
  if (0 < num_points) {
    fStack_84 = pos_center.y;
    lVar5 = (long)iVar2 * 0x14;
    uVar6 = 0;
    do {
      t = (float)(int)uVar6 / (float)(num_points + -1);
      fVar7 = (1.0 - t) * a0 + t * a1;
      fVar8 = Math::Cos(fVar7);
      fVar7 = Math::Sin(fVar7);
      local_88 = pos_center.x;
      *(ulong *)((long)&(((this->vertices->
                          super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
                          super__Vector_impl_data._M_start)->position).x + lVar5) =
           CONCAT44(fVar7 * r.y + fStack_84,fVar8 * r.x + local_88);
      CVar4 = Math::RoundedLerp(t,color0,color1);
      *(ColourbPremultiplied *)
       ((long)&(((this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                 _M_impl.super__Vector_impl_data._M_start)->colour).red + lVar5) = CVar4;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x14;
    } while ((uint)num_points != uVar6);
  }
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArc(Vector2f pos_center, Vector2f r, float a0, float a1, ColourbPremultiplied color0, ColourbPremultiplied color1,
	int num_points)
{
	RMLUI_ASSERT(num_points >= 2 && r.x > 0 && r.y > 0);

	const int offset_vertices = (int)vertices.size();

	vertices.resize(offset_vertices + num_points);

	for (int i = 0; i < num_points; i++)
	{
		const float t = float(i) / float(num_points - 1);

		const float a = Math::Lerp(t, a0, a1);

		const Vector2f unit_vector(Math::Cos(a), Math::Sin(a));

		vertices[offset_vertices + i].position = unit_vector * r + pos_center;
		vertices[offset_vertices + i].colour = Math::RoundedLerp(t, color0, color1);
	}
}